

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O0

int logger_timed_log_test(bool is_global)

{
  byte bVar1;
  bool bVar2;
  SimpleLogger **ppSVar3;
  int __how;
  byte in_DIL;
  int __fd;
  thread t2;
  thread t1;
  type worker_func;
  Timer tt;
  SimpleLogger *ll;
  string filename;
  string prefix;
  int in_stack_ffffffffffffff1c;
  SimpleLogger *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  SimpleLogger *this;
  undefined1 local_c0 [12];
  undefined4 local_b4;
  int *in_stack_ffffffffffffff50;
  type *__f;
  undefined7 in_stack_ffffffffffffff61;
  TestPosition in_stack_ffffffffffffff6c;
  string *in_stack_ffffffffffffff70;
  type local_88 [2];
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  SimpleLogger *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffd4;
  uint64_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  SimpleLogger *in_stack_fffffffffffffff0;
  
  bVar1 = in_DIL & 1;
  this = (SimpleLogger *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd8,"logger_timed_log_test",(allocator *)this);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  TestSuite::clearTestFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  TestSuite::getTestFileName(in_stack_ffffffffffffffb8);
  std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&local_88[0].is_global);
  local_88[0].ll = (SimpleLogger **)0x0;
  TestSuite::Timer::Timer((Timer *)in_stack_ffffffffffffff20);
  ppSVar3 = (SimpleLogger **)operator_new(0x2c8);
  SimpleLogger::SimpleLogger
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  local_88[0].ll = ppSVar3;
  SimpleLogger::start(in_stack_ffffffffffffffc0);
  SimpleLogger::setLogLevel(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  __f = local_88;
  local_b4 = 1;
  std::thread::thread<logger_timed_log_test(bool)::__0&,int,void>
            ((thread *)(CONCAT71(in_stack_ffffffffffffff61,in_DIL) & 0xffffffffffffff01),__f,
             in_stack_ffffffffffffff50);
  __how = (int)&stack0xffffffffffffff58;
  std::thread::thread<logger_timed_log_test(bool)::__0&,int,void>
            ((thread *)CONCAT71(in_stack_ffffffffffffff61,bVar1),__f,in_stack_ffffffffffffff50);
  bVar2 = std::thread::joinable((thread *)in_stack_ffffffffffffff20);
  if (bVar2) {
    std::thread::join();
  }
  __fd = (int)local_c0;
  bVar2 = std::thread::joinable((thread *)in_stack_ffffffffffffff20);
  if (bVar2) {
    __fd = (int)local_c0;
    std::thread::join();
  }
  if (local_88[0].ll != (SimpleLogger **)0x0) {
    ppSVar3 = local_88[0].ll;
    SimpleLogger::~SimpleLogger(this);
    operator_delete(ppSVar3);
    __fd = (int)ppSVar3;
  }
  SimpleLogger::shutdown(__fd,__how);
  TestSuite::clearTestFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  std::thread::~thread((thread *)0x1091d0);
  std::thread::~thread((thread *)0x1091da);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return 0;
}

Assistant:

int logger_timed_log_test(bool is_global) {
    const std::string prefix = TEST_SUITE_AUTO_PREFIX;
    TestSuite::clearTestFile(prefix);
    std::string filename = TestSuite::getTestFileName(prefix) + ".log";

    SimpleLogger* ll = nullptr;
    TestSuite::Timer tt;

    ll = new SimpleLogger(filename, 128, 1024*1024, 0);
    ll->start();
    ll->setLogLevel(6);

    auto worker_func = [&ll, is_global](int tid) -> void {
        for (size_t ii=0; ii<100; ++ii) {
            SimpleLogger::Levels lv = (ii < 50)
                                      ? SimpleLogger::TRACE
                                      : SimpleLogger::UNKNOWN;
            if (is_global) {
                _timed_log_g(ll, 100, lv, SimpleLogger::INFO,
                             "thread %d, %zu", tid, ii);
            } else {
                _timed_log_t(ll, 100, lv, SimpleLogger::INFO,
                             "thread %d %zu", tid, ii);
            }
            TestSuite::sleep_ms(10);
        }
    };

    std::thread t1(worker_func, 1);
    std::thread t2(worker_func, 2);
    if (t1.joinable()) t1.join();
    if (t2.joinable()) t2.join();

    delete ll;

    SimpleLogger::shutdown();
    TestSuite::clearTestFile(prefix, TestSuite::END_OF_TEST);
    return 0;
}